

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ComponentPtr __thiscall
libcellml::Parser::ParserImpl::loadComponentRef
          (ParserImpl *this,ModelPtr *model,XmlNodePtr *node,NameList *usedNames)

{
  pointer puVar1;
  pointer psVar2;
  IssueImpl *pIVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var4;
  size_type sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_02;
  bool bVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  long *plVar8;
  undefined8 *puVar9;
  element_type *peVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  XmlNode *pXVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  size_type *psVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  pointer psVar17;
  undefined8 uVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  ComponentEntity *pCVar19;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_R8;
  XmlNodePtr XVar20;
  ComponentPtr CVar21;
  string textNode;
  IssuePtr issue_3;
  string childEncapsulationId;
  IssuePtr issue;
  string parentComponentName;
  IssuePtr issue_4;
  IssuePtr issue_2;
  XmlNodePtr childComponentNode;
  string encapsulationId;
  XmlAttributePtr attribute;
  ComponentPtr childComponent;
  undefined1 local_1b8 [32];
  string local_198;
  IssuePtr local_178;
  element_type local_168;
  string local_158;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  IssuePtr local_d0;
  string local_c0;
  undefined1 local_a0 [16];
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  ParserImpl *local_70;
  XmlAttributePtr local_68;
  ComponentPtr local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_40;
  NameList *local_38;
  
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_90._0_8_ = local_90 + 0x10;
  local_90._8_8_ = 0;
  local_90[0x10] = 0;
  local_70 = this;
  local_40 = in_R8;
  local_38 = usedNames;
  XmlNode::firstAttribute((XmlNode *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar13 = &local_158.field_2;
    do {
      bVar6 = XmlAttribute::isType
                        (local_68.
                         super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,"component","");
      if (bVar6) {
        XmlAttribute::value_abi_cxx11_
                  (&local_158,
                   local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar13) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        this_02 = local_40;
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (*(undefined8 *)local_40,*(undefined8 *)(local_40 + 8),&local_f0);
        if (_Var7._M_current ==
            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this_02 + 8)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>(this_02,&local_f0);
        }
        else {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)(local_130._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_110,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2b44cb);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar8[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar8;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar11) {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar9[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_198._M_string_length = puVar9[1];
          *puVar9 = paVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_198,(ulong)local_f0._M_dataplus._M_p);
          local_1b8._0_8_ = local_1b8 + 0x10;
          pXVar12 = (XmlNode *)(plVar8 + 2);
          if ((XmlNode *)*plVar8 == pXVar12) {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._24_8_ = plVar8[3];
          }
          else {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._0_8_ = (XmlNode *)*plVar8;
          }
          local_1b8._8_8_ = plVar8[1];
          *plVar8 = (long)pXVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_1b8);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar11) {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158.field_2._8_8_ = plVar8[3];
            local_158._M_dataplus._M_p = (pointer)paVar13;
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_158._M_string_length = plVar8[1];
          *plVar8 = (long)paVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar13) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_168._vptr_Issue)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_130._M_dataplus._M_p + 8) + 0x28),
                     (ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_130._M_dataplus._M_p + 8),
                     COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)&local_130);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length);
          }
        }
        bVar6 = ComponentEntity::containsComponent
                          ((ComponentEntity *)
                           (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,&local_f0,true);
        if (bVar6) {
          ComponentEntity::takeComponent
                    ((ComponentEntity *)&local_158,
                     (string *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,SUB81(&local_f0,0));
          sVar5 = local_158._M_string_length;
          _Var4._M_p = local_158._M_dataplus._M_p;
          local_158._M_dataplus._M_p = (pointer)0x0;
          local_158._M_string_length = 0;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(local_70->super_LoggerImpl).mErrors.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
          *(pointer *)
           &(local_70->super_LoggerImpl).mErrors.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> = _Var4._M_p;
          *(size_type *)
           ((long)&(local_70->super_LoggerImpl).mErrors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) = sVar5;
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
          }
        }
        else {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)(local_130._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_110,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2b44cb);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar8[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar8;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar11) {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar9[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_198._M_string_length = puVar9[1];
          *puVar9 = paVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_198,(ulong)local_f0._M_dataplus._M_p);
          local_1b8._0_8_ = local_1b8 + 0x10;
          pXVar12 = (XmlNode *)(plVar8 + 2);
          if ((XmlNode *)*plVar8 == pXVar12) {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._24_8_ = plVar8[3];
          }
          else {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._0_8_ = (XmlNode *)*plVar8;
          }
          local_1b8._8_8_ = plVar8[1];
          *plVar8 = (long)pXVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_1b8);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar11) {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158.field_2._8_8_ = plVar8[3];
            local_158._M_dataplus._M_p = (pointer)paVar13;
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_158._M_string_length = plVar8[1];
          *plVar8 = (long)paVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar13) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_168._vptr_Issue)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_130._M_dataplus._M_p + 8) + 0x28),
                     (ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_130._M_dataplus._M_p + 8),
                     COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)&local_130);
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._M_string_length;
        }
LAB_00250eab:
        if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
        }
      }
      else {
        bVar6 = isIdAttribute(&local_68,
                              *(bool *)&model[6].
                                        super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi);
        if (!bVar6) {
          Issue::IssueImpl::create();
          pIVar3 = *(IssueImpl **)(local_c0._M_dataplus._M_p + 8);
          NamedEntity::name_abi_cxx11_
                    (&local_110,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x2b44cb);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar8[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar8;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar11) {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar9[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_198._M_string_length = puVar9[1];
          *puVar9 = paVar11;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          XmlAttribute::name_abi_cxx11_
                    (&local_130,
                     local_68.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          uVar18 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            uVar18 = local_198.field_2._M_allocated_capacity;
          }
          puVar1 = (pointer)(local_198._M_string_length +
                            (long)(_func_int ***)local_130._M_string_length);
          if ((ulong)uVar18 < puVar1) {
            uVar18 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              uVar18 = local_130.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < puVar1) goto LAB_00250ac8;
            plVar8 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_130,0,(char *)0x0,
                                        (ulong)local_198._M_dataplus._M_p);
          }
          else {
LAB_00250ac8:
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_198,(ulong)local_130._M_dataplus._M_p);
          }
          local_1b8._0_8_ = local_1b8 + 0x10;
          pXVar12 = (XmlNode *)(plVar8 + 2);
          if ((XmlNode *)*plVar8 == pXVar12) {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._24_8_ = plVar8[3];
          }
          else {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._0_8_ = (XmlNode *)*plVar8;
          }
          local_1b8._8_8_ = plVar8[1];
          *plVar8 = (long)pXVar12;
          plVar8[1] = 0;
          *(undefined1 *)&pXVar12->mPimpl = 0;
          plVar8 = (long *)std::__cxx11::string::append(local_1b8);
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 == paVar11) {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158.field_2._8_8_ = plVar8[3];
            local_158._M_dataplus._M_p = (pointer)paVar13;
          }
          else {
            local_158.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_158._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_158._M_string_length = plVar8[1];
          *plVar8 = (long)paVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar13) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_168._vptr_Issue)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((AnyCellmlElementImpl *)
                     **(undefined8 **)(*(long *)(local_c0._M_dataplus._M_p + 8) + 0x28),
                     (ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    (*(IssueImpl **)(local_c0._M_dataplus._M_p + 8),COMPONENT_REF_ELEMENT);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,(IssuePtr *)&local_c0);
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._M_string_length;
          goto LAB_00250eab;
        }
        XmlAttribute::value_abi_cxx11_
                  (&local_158,
                   local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        std::__cxx11::string::operator=((string *)(local_a0 + 0x10),(string *)&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != paVar13) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
      }
      XmlAttribute::next((XmlAttribute *)&local_158);
      _Var16._M_pi = local_68.
                     super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length;
      local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._M_dataplus._M_p;
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      if (_Var16._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var16._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._M_string_length);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0);
  }
  pCVar19 = *(ComponentEntity **)
             &(local_70->super_LoggerImpl).mErrors.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  if ((pCVar19 == (ComponentEntity *)0x0) && (local_f0._M_string_length == 0)) {
    Issue::IssueImpl::create();
    pIVar3 = (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_198,
               (NamedEntity *)
               (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,0x2b44cb);
    pXVar12 = (XmlNode *)(plVar8 + 2);
    if ((XmlNode *)*plVar8 == pXVar12) {
      local_1b8._16_8_ = pXVar12->mPimpl;
      local_1b8._24_8_ = plVar8[3];
      local_1b8._0_8_ = (XmlNode *)(local_1b8 + 0x10);
    }
    else {
      local_1b8._16_8_ = pXVar12->mPimpl;
      local_1b8._0_8_ = (XmlNode *)*plVar8;
    }
    local_1b8._8_8_ = plVar8[1];
    *plVar8 = (long)pXVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append(local_1b8);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 == paVar13) {
      local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_158.field_2._8_8_ = plVar8[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_158._M_string_length = plVar8[1];
    *plVar8 = (long)paVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar3,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
              ((((local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl,(ModelPtr *)node);
    Issue::IssueImpl::setReferenceRule
              ((local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,COMPONENT_REF_COMPONENT_ATTRIBUTE);
    Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_178);
    if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else if (pCVar19 != (ComponentEntity *)0x0) {
    ComponentEntity::setEncapsulationId(pCVar19,(string *)(local_a0 + 0x10));
  }
  XVar20 = XmlNode::firstChild((XmlNode *)local_a0);
  _Var16 = XVar20.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_allocated_capacity =
       local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
  do {
    if ((XmlNode *)local_a0._0_8_ == (XmlNode *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        _Var16._M_pi = extraout_RDX_02;
      }
      if ((pointer)local_a0._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
        _Var16._M_pi = extraout_RDX_03;
      }
      if (local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var16._M_pi = extraout_RDX_04;
      }
      if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
        operator_delete((void *)local_90._0_8_,CONCAT71(uStack_7f,local_90[0x10]) + 1);
        _Var16._M_pi = extraout_RDX_05;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,
                        CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                 local_f0.field_2._M_local_buf[0]) + 1);
        _Var16._M_pi = extraout_RDX_06;
      }
      CVar21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var16._M_pi;
      CVar21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_70;
      return (ComponentPtr)
             CVar21.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (*(char *)((long)&model[6].super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 1) == '\x01') {
      bVar6 = XmlNode::isCellml20Element((XmlNode *)local_a0._0_8_,"component_ref");
    }
    else {
      bVar6 = XmlNode::isCellml1XElement((XmlNode *)local_a0._0_8_,"component_ref");
    }
    if (bVar6 == false) {
      bVar6 = XmlNode::isText((XmlNode *)local_a0._0_8_);
      if (bVar6) {
        XmlNode::convertToString_abi_cxx11_((string *)local_1b8,(XmlNode *)local_a0._0_8_);
        bVar6 = hasNonWhitespaceCharacters((string *)local_1b8);
        if (bVar6) {
          Issue::IssueImpl::create();
          pIVar3 = (local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_c0,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x2b44cb);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          puVar14 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_130.field_2._M_allocated_capacity = *puVar14;
            local_130.field_2._8_8_ = plVar8[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *puVar14;
            local_130._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_130._M_string_length = plVar8[1];
          *plVar8 = (long)puVar14;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar15 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_110.field_2._M_allocated_capacity = *psVar15;
            local_110.field_2._8_8_ = plVar8[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar15;
            local_110._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_110._M_string_length = plVar8[1];
          *plVar8 = (long)psVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_110,local_1b8._0_8_);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar8[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar8;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar13) {
            local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar9[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_198._M_string_length = puVar9[1];
          *puVar9 = paVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,&local_198);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_168._vptr_Issue)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            (ulong)(local_c0.field_2._M_allocated_capacity + 1));
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,(ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    ((local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,XML_UNEXPECTED_CHARACTER);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_d0);
          if ((pointer)local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
        }
      }
      else {
        bVar6 = XmlNode::isComment((XmlNode *)local_a0._0_8_);
        if (!bVar6) {
          Issue::IssueImpl::create();
          pIVar3 = (local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->mPimpl;
          NamedEntity::name_abi_cxx11_
                    (&local_130,
                     (NamedEntity *)
                     (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x2b44cb);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          psVar15 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_110.field_2._M_allocated_capacity = *psVar15;
            local_110.field_2._8_8_ = plVar8[3];
          }
          else {
            local_110.field_2._M_allocated_capacity = *psVar15;
            local_110._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_110._M_string_length = plVar8[1];
          *plVar8 = (long)psVar15;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               &local_168;
          peVar10 = (element_type *)(plVar8 + 2);
          if ((element_type *)*plVar8 == peVar10) {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_168.mPimpl = (IssueImpl *)plVar8[3];
          }
          else {
            local_168._vptr_Issue = peVar10->_vptr_Issue;
            local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)*plVar8;
          }
          local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
          *plVar8 = (long)peVar10;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          XmlNode::name_abi_cxx11_(&local_c0,(XmlNode *)local_a0._0_8_);
          psVar17 = (pointer)0xf;
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            psVar17 = (pointer)local_168._vptr_Issue;
          }
          psVar2 = (pointer)((long)&(local_178.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                            (long)(_func_int ***)local_c0._M_string_length);
          if (psVar17 < psVar2) {
            uVar18 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              uVar18 = local_c0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < psVar2) goto LAB_00251422;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_c0,0,(char *)0x0,
                                (ulong)local_178.
                                       super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr);
          }
          else {
LAB_00251422:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_178,(ulong)local_c0._M_dataplus._M_p);
          }
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar13) {
            local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_198.field_2._8_8_ = puVar9[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_198._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_198._M_string_length = puVar9[1];
          *puVar9 = paVar13;
          puVar9[1] = 0;
          paVar13->_M_local_buf[0] = '\0';
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
          local_1b8._0_8_ = local_1b8 + 0x10;
          pXVar12 = (XmlNode *)(plVar8 + 2);
          if ((XmlNode *)*plVar8 == pXVar12) {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._24_8_ = plVar8[3];
          }
          else {
            local_1b8._16_8_ = pXVar12->mPimpl;
            local_1b8._0_8_ = (XmlNode *)*plVar8;
          }
          local_1b8._8_8_ = plVar8[1];
          *plVar8 = (long)pXVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          Issue::IssueImpl::setDescription(pIVar3,(string *)local_1b8);
          if ((XmlNode *)local_1b8._0_8_ != (XmlNode *)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,
                            (ulong)(local_c0.field_2._M_allocated_capacity + 1));
          }
          if (local_178.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              &local_168) {
            operator_delete(local_178.
                            super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (ulong)((long)&((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                             *)local_168._vptr_Issue)->_M_ptr + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          AnyCellmlElement::AnyCellmlElementImpl::setEncapsulation
                    ((((local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->mPimpl->mItem).
                      super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,(ModelPtr *)node);
          Issue::IssueImpl::setReferenceRule
                    ((local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->mPimpl,COMPONENT_REF_CHILD);
          Logger::LoggerImpl::addIssue((LoggerImpl *)model,&local_d0);
          _Var16._M_pi = local_d0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          goto LAB_00251177;
        }
      }
    }
    else {
      loadComponentRef((ParserImpl *)local_1b8,model,node,(NameList *)local_a0);
      this_01._M_pi =
           local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
      local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1b8._0_8_;
      local_1b8._0_8_ = (XmlNode *)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      if ((pointer)this_01._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
        _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      }
LAB_00251177:
      if ((pointer)_Var16._M_pi != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var16._M_pi);
      }
    }
    if (local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      pCVar19 = *(ComponentEntity **)
                 &(local_70->super_LoggerImpl).mErrors.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      if (pCVar19 == (ComponentEntity *)0x0) {
        pCVar19 = (ComponentEntity *)
                  (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      ComponentEntity::addComponent(pCVar19,&local_58);
    }
    XVar20 = XmlNode::next((XmlNode *)local_1b8);
    uVar18 = local_a0._8_8_;
    local_a0._8_8_ = local_1b8._8_8_;
    local_a0._0_8_ = local_1b8._0_8_;
    _Var16 = XVar20.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    local_1b8._0_8_ = (XmlNode *)0x0;
    local_1b8._8_8_ = (pointer)0x0;
    if ((pointer)uVar18 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar18);
      _Var16._M_pi = extraout_RDX;
    }
    if ((pointer)local_1b8._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      _Var16._M_pi = extraout_RDX_00;
    }
    if ((pointer)local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var16._M_pi = extraout_RDX_01;
    }
  } while( true );
}

Assistant:

ComponentPtr Parser::ParserImpl::loadComponentRef(const ModelPtr &model, const XmlNodePtr &node, NameList &usedNames)
{
    ComponentPtr parentComponent = nullptr;
    std::string parentComponentName;
    std::string encapsulationId;
    // Check for a component in the parent component_ref.
    XmlAttributePtr attribute = node->firstAttribute();
    while (attribute != nullptr) {
        if (attribute->isType("component")) {
            parentComponentName = attribute->value();

            if (std::find(usedNames.begin(), usedNames.end(), parentComponentName) == usedNames.end()) {
                usedNames.emplace_back(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it is not unique.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_UNIQUE);
                addIssue(issue);
            }

            if (model->containsComponent(parentComponentName)) {
                // Will re-add this to the model once we encapsulate the child(ren).
                parentComponent = model->takeComponent(parentComponentName);
            } else {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' specifies '" + parentComponentName + "' as a component in a component_ref but it does not exist in the model.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE_REFERENCE);
                addIssue(issue);
            }
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            encapsulationId = attribute->value();
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid component_ref attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }
    if (!parentComponent && parentComponentName.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' does not have a valid component attribute in a component_ref element.");
        issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_COMPONENT_ATTRIBUTE);
        addIssue(issue);
    } else if (parentComponent) {
        parentComponent->setEncapsulationId(encapsulationId);
    }

    // Get first child of this parent component_ref.
    XmlNodePtr childComponentNode = node->firstChild();

    // Loop over encapsulated children.
    std::string childEncapsulationId;
    while (childComponentNode) {
        ComponentPtr childComponent = nullptr;
        if (parseNode(childComponentNode, "component_ref")) {
            childComponent = loadComponentRef(model, childComponentNode, usedNames);
        } else if (childComponentNode->isText()) {
            const std::string textNode = childComponentNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childComponentNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Encapsulation in model '" + model->name() + "' has an invalid child element '" + childComponentNode->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setEncapsulation(model);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::COMPONENT_REF_CHILD);
            addIssue(issue);
        }

        if (childComponent) {
            // Set parent/child encapsulation relationship.
            if (parentComponent) {
                parentComponent->addComponent(childComponent);
            } else {
                // Making sure that children which were taken from parents above, but have
                // invalid parents, are still included in the model.
                model->addComponent(childComponent);
            }
        }
        childComponentNode = childComponentNode->next();
    }

    return parentComponent;
}